

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O0

void P_Thing_SetVelocity(AActor *actor,DVector3 *vec,bool add,bool setbob)

{
  TVector3<double> local_30;
  bool setbob_local;
  DVector3 *pDStack_18;
  bool add_local;
  DVector3 *vec_local;
  AActor *actor_local;
  
  if (actor != (AActor *)0x0) {
    local_30.Z._6_1_ = setbob;
    local_30.Z._7_1_ = add;
    pDStack_18 = vec;
    vec_local = (DVector3 *)actor;
    if ((!add) && (TVector3<double>::Zero(&actor->Vel), vec_local[0x17].Y != 0.0)) {
      TVector2<double>::Zero((TVector2<double> *)((long)vec_local[0x17].Y + 0x80));
    }
    TVector3<double>::operator+=((TVector3<double> *)&vec_local[8].Y,pDStack_18);
    if (((local_30.Z._6_1_ & 1) != 0) && (vec_local[0x17].Y != 0.0)) {
      TVector3<double>::XY(&local_30);
      TVector2<double>::operator+=
                ((TVector2<double> *)((long)vec_local[0x17].Y + 0x80),(TVector2<double> *)&local_30)
      ;
    }
  }
  return;
}

Assistant:

void P_Thing_SetVelocity(AActor *actor, const DVector3 &vec, bool add, bool setbob)
{
	if (actor != NULL)
	{
		if (!add)
		{
			actor->Vel.Zero();
			if (actor->player != NULL) actor->player->Vel.Zero();
		}
		actor->Vel += vec;
		if (setbob && actor->player != NULL)
		{
			actor->player->Vel += vec.XY();
		}
	}
}